

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGeneratedFileStream.cxx
# Opt level: O1

int testGeneratedFileStream(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  long *__s;
  long **pplVar5;
  ostream *poVar6;
  string file1tmp;
  string file4tmp;
  string file3tmp;
  string file2tmp;
  string file4;
  string file3;
  string file2;
  string file1;
  cmGeneratedFileStream gm;
  allocator local_399;
  string local_398;
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288 [2];
  cmGeneratedFileStream local_278;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278);
  local_298 = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"generatedFile1","");
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"generatedFile2","");
  local_2d8 = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"generatedFile3","");
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"generatedFile4","");
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_378,local_298,(long)local_298 + local_290);
  std::__cxx11::string::append((char *)local_378);
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_318,local_2b8,(long)local_2b8 + local_2b0);
  std::__cxx11::string::append((char *)local_318);
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_338,local_2d8,(long)local_2d8 + local_2d0);
  std::__cxx11::string::append((char *)local_338);
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_358,local_2f8,(long)local_2f8 + local_2f0);
  pplVar5 = local_358;
  std::__cxx11::string::append((char *)pplVar5);
  cmGeneratedFileStream::Open(&local_278,(char *)local_298,false,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"This is generated file 1",0x18);
  cmGeneratedFileStream::Close(&local_278);
  cmGeneratedFileStream::Open(&local_278,(char *)local_2b8,false,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"This is generated file 2",0x18);
  cmGeneratedFileStream::Close(&local_278);
  cmGeneratedFileStream::Open(&local_278,(char *)local_2d8,false,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"This is generated file 3",0x18);
  cmGeneratedFileStream::Close(&local_278);
  cmGeneratedFileStream::Open(&local_278,(char *)local_2f8,false,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_278,"This is generated file 4",0x18);
  cmGeneratedFileStream::Close(&local_278);
  bVar2 = cmsys::SystemTools::FileExists((char *)local_298);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileExists((char *)local_2b8);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
      __s = local_2b8;
      goto LAB_0012b2c9;
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)local_2d8);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Something wrong with cmGeneratedFileStream. Found file: ",
                 0x38);
      __s = local_2d8;
      goto LAB_0012b2c9;
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)local_2f8);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
      __s = local_2f8;
      goto LAB_0012b2c9;
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)local_378[0]);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a);
      __s = local_378[0];
      goto LAB_0012b2c9;
    }
    bVar2 = cmsys::SystemTools::FileExists((char *)local_318[0]);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a);
      pplVar5 = local_318;
    }
    else {
      bVar2 = cmsys::SystemTools::FileExists((char *)local_338[0]);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a
                  );
        pplVar5 = local_338;
      }
      else {
        bVar2 = cmsys::SystemTools::FileExists((char *)local_358[0]);
        if (!bVar2) {
          iVar4 = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"cmGeneratedFileStream works\n",0x1c);
          goto LAB_0012b325;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a
                  );
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,(char *)*pplVar5);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
    __s = local_298;
LAB_0012b2c9:
    if (__s == (long *)0x0) {
      poVar6 = (ostream *)&std::cout;
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2295b8);
    }
    else {
      sVar3 = strlen((char *)__s);
      poVar6 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar3);
    }
  }
  iVar4 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
LAB_0012b325:
  std::__cxx11::string::string((string *)&local_398,(char *)local_298,&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  paVar1 = &local_398.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_2b8,&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_2d8,&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_2f8,&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_378[0],&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_318[0],&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_338[0],&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_398,(char *)local_358[0],&local_399);
  cmsys::SystemTools::RemoveFile(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != paVar1) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if (local_378[0] != local_368) {
    operator_delete(local_378[0],local_368[0] + 1);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
  if (local_298 != local_288) {
    operator_delete(local_298,local_288[0] + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  return iVar4;
}

Assistant:

int testGeneratedFileStream(int, char*[])
{
  int failed = 0;
  cmGeneratedFileStream gm;
  std::string file1 = "generatedFile1";
  std::string file2 = "generatedFile2";
  std::string file3 = "generatedFile3";
  std::string file4 = "generatedFile4";
  std::string file1tmp = file1 + ".tmp";
  std::string file2tmp = file2 + ".tmp";
  std::string file3tmp = file3 + ".tmp";
  std::string file4tmp = file4 + ".tmp";
  gm.Open(file1.c_str());
  gm << "This is generated file 1";
  gm.Close();
  gm.Open(file2.c_str());
  gm << "This is generated file 2";
  gm.Close();
  gm.Open(file3.c_str());
  gm << "This is generated file 3";
  gm.Close();
  gm.Open(file4.c_str());
  gm << "This is generated file 4";
  gm.Close();
  if ( cmSystemTools::FileExists(file1.c_str()) )
    {
    if ( cmSystemTools::FileExists(file2.c_str()) )
      {
      if ( cmSystemTools::FileExists(file3.c_str()) )
        {
        if ( cmSystemTools::FileExists(file4.c_str()) )
          {
          if ( cmSystemTools::FileExists(file1tmp.c_str()) )
            {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary file is still here: ", file1tmp.c_str());
            }
          else if ( cmSystemTools::FileExists(file2tmp.c_str()) )
            {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary file is still here: ", file2tmp.c_str());
            }
          else if ( cmSystemTools::FileExists(file3tmp.c_str()) )
            {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary file is still here: ", file3tmp.c_str());
            }
          else if ( cmSystemTools::FileExists(file4tmp.c_str()) )
            {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary file is still here: ", file4tmp.c_str());
            }
          else
            {
            std::cout << "cmGeneratedFileStream works\n";
            }
          }
        else
          {
          cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ", file4.c_str());
          }
        }
      else
        {
        cmFailed("Something wrong with cmGeneratedFileStream. Found file: ", file3.c_str());
        }
      }
    else
      {
      cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ", file2.c_str());
      }
    }
  else
    {
    cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ", file1.c_str());
    }
  cmSystemTools::RemoveFile(file1.c_str());
  cmSystemTools::RemoveFile(file2.c_str());
  cmSystemTools::RemoveFile(file3.c_str());
  cmSystemTools::RemoveFile(file4.c_str());
  cmSystemTools::RemoveFile(file1tmp.c_str());
  cmSystemTools::RemoveFile(file2tmp.c_str());
  cmSystemTools::RemoveFile(file3tmp.c_str());
  cmSystemTools::RemoveFile(file4tmp.c_str());

  return failed;
}